

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O3

int read_image_tga(gdIOCtx *ctx,oTga *tga)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  void *ptr;
  void *buf;
  ulong uVar10;
  uint a;
  int iVar11;
  int iVar12;
  size_t size;
  
  bVar1 = tga->bits;
  iVar6 = tga->width;
  iVar11 = tga->height;
  iVar5 = overflow2(iVar6,iVar11);
  iVar12 = -1;
  if (iVar5 == 0) {
    bVar4 = bVar1 >> 3;
    iVar5 = overflow2(tga->height * tga->width,(uint)bVar4);
    if (iVar5 == 0) {
      a = iVar11 * iVar6 * (uint)bVar4;
      iVar6 = overflow2(a,4);
      if ((iVar6 == 0) && ((tga->imagetype | 8) == 10)) {
        size = (size_t)(int)a;
        piVar9 = (int *)gdMalloc(size * 4);
        tga->bitmap = piVar9;
        if (piVar9 != (int *)0x0) {
          if (tga->imagetype == '\n') {
            ptr = gdMalloc(size * 4);
            if (ptr == (void *)0x0) {
              return -1;
            }
            buf = gdMalloc(size);
            if (buf == (void *)0x0) {
              gd_error("gd-tga: premature end of image data\n");
              iVar12 = -1;
            }
            else {
              uVar7 = gdGetBuf(buf,a,ctx);
              if ((int)uVar7 < 1) {
                gdFree(buf);
                iVar12 = -1;
              }
              else {
                uVar10 = 0;
                do {
                  *(uint *)((long)ptr + uVar10 * 4) = (uint)*(byte *)((long)buf + uVar10);
                  uVar10 = uVar10 + 1;
                } while (uVar7 != uVar10);
                if (0 < (int)a) {
                  uVar8 = 0;
                  iVar6 = 0;
                  do {
                    uVar3 = (uint)bVar4;
                    if ((int)uVar7 < (int)(iVar6 + uVar3)) {
LAB_0011f898:
                      gdFree(ptr);
                      goto LAB_0011f862;
                    }
                    uVar2 = *(uint *)((long)ptr + (long)iVar6 * 4);
                    if ((char)uVar2 < '\0') {
                      iVar11 = (uVar2 & 0xffffff7f) + 1;
                      if ((int)(iVar11 * uVar3 + uVar8) <= (int)a) {
                        iVar5 = iVar6 + 1;
                        iVar6 = iVar5 + uVar3;
                        if (iVar6 <= (int)uVar7) {
                          if ((int)uVar2 < 0) {
                            uVar10 = (ulong)uVar8;
                          }
                          else {
                            uVar10 = (ulong)(int)uVar8;
                            do {
                              memcpy(tga->bitmap + uVar10,(void *)((long)ptr + (long)iVar5 * 4),
                                     (ulong)((uint)bVar4 * 4));
                              uVar10 = uVar10 + (bVar1 >> 3);
                              iVar11 = iVar11 + -1;
                            } while (iVar11 != 0);
                          }
                          uVar8 = (uint)uVar10;
                          goto LAB_0011f830;
                        }
                      }
                      goto LAB_0011f898;
                    }
                    iVar11 = (uVar2 + 1) * uVar3;
                    if ((int)a < (int)(iVar11 + uVar8)) {
LAB_0011f8a2:
                      gdFree(ptr);
                      iVar12 = -1;
                      ptr = buf;
                      goto LAB_0011f8b5;
                    }
                    iVar5 = iVar6 + 1;
                    iVar6 = iVar11 + iVar5;
                    if ((int)uVar7 < iVar6) goto LAB_0011f8a2;
                    memcpy(tga->bitmap + (int)uVar8,(void *)((long)ptr + (long)iVar5 * 4),
                           (long)iVar11 << 2);
                    uVar8 = iVar11 + uVar8;
LAB_0011f830:
                  } while ((int)uVar8 < (int)a);
                }
                gdFree(ptr);
                iVar12 = 1;
                ptr = buf;
              }
            }
          }
          else {
            if (tga->imagetype != '\x02') {
              return 1;
            }
            ptr = gdMalloc(size);
            if (ptr == (void *)0x0) {
              return -1;
            }
            uVar7 = gdGetBuf(ptr,a,ctx);
            if (uVar7 == a) {
              iVar12 = 1;
              if (0 < (int)a) {
                piVar9 = tga->bitmap;
                uVar10 = 0;
                do {
                  piVar9[uVar10] = (uint)*(byte *)((long)ptr + uVar10);
                  uVar10 = uVar10 + 1;
                } while (a != uVar10);
              }
            }
            else {
              gd_error("gd-tga: premature end of image data\n");
              buf = ptr;
LAB_0011f862:
              iVar12 = -1;
              ptr = buf;
            }
          }
LAB_0011f8b5:
          gdFree(ptr);
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int read_image_tga( gdIOCtx *ctx, oTga *tga )
{
	int pixel_block_size = (tga->bits / 8);
	int image_block_size = (tga->width * tga->height) * pixel_block_size;
	int* decompression_buffer = NULL;
	unsigned char* conversion_buffer = NULL;
	int buffer_caret = 0;
	int bitmap_caret = 0;
	int i = 0;
	int encoded_pixels;
	int rle_size;

	if(overflow2(tga->width, tga->height)) {
		return -1;
	}

	if(overflow2(tga->width * tga->height, pixel_block_size)) {
		return -1;
	}

	if(overflow2(image_block_size, sizeof(int))) {
		return -1;
	}

	/*! \todo Add more image type support.
	 */
	if (tga->imagetype != TGA_TYPE_RGB && tga->imagetype != TGA_TYPE_RGB_RLE)
		return -1;

	/*!	\brief Allocate memmory for image block
	 *  Allocate a chunk of memory for the image block to be passed into.
	 */
	tga->bitmap = (int *) gdMalloc(image_block_size * sizeof(int));
	if (tga->bitmap == NULL)
		return -1;

	switch (tga->imagetype) {
	case TGA_TYPE_RGB:
		/*! \brief Read in uncompressed RGB TGA
		 *  Chunk load the pixel data from an uncompressed RGB type TGA.
		 */
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			return -1;
		}

		if (gdGetBuf(conversion_buffer, image_block_size, ctx) != image_block_size) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree(conversion_buffer);
			return -1;
		}

		while (buffer_caret < image_block_size) {
			tga->bitmap[buffer_caret] = (int) conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		gdFree(conversion_buffer);
		break;

	case TGA_TYPE_RGB_RLE:
		/*! \brief Read in RLE compressed RGB TGA
		 *  Chunk load the pixel data from an RLE compressed RGB type TGA.
		 */
		decompression_buffer = (int*) gdMalloc(image_block_size * sizeof(int));
		if (decompression_buffer == NULL) {
			return -1;
		}
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree( decompression_buffer );
			return -1;
		}

		rle_size = gdGetBuf(conversion_buffer, image_block_size, ctx);
		if (rle_size <= 0) {
			gdFree(conversion_buffer);
			gdFree(decompression_buffer);
			return -1;
		}

		buffer_caret = 0;

		while( buffer_caret < rle_size) {
			decompression_buffer[buffer_caret] = (int)conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		buffer_caret = 0;

		while( bitmap_caret < image_block_size ) {

			if (buffer_caret + pixel_block_size > rle_size) {
				gdFree( decompression_buffer );
				gdFree( conversion_buffer );
				return -1;
			}

			if ((decompression_buffer[buffer_caret] & TGA_RLE_FLAG) == TGA_RLE_FLAG) {
				encoded_pixels = ( ( decompression_buffer[ buffer_caret ] & ~TGA_RLE_FLAG ) + 1 );
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + pixel_block_size > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				for (i = 0; i < encoded_pixels; i++) {
					memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, pixel_block_size * sizeof(int));
					bitmap_caret += pixel_block_size;
				}
				buffer_caret += pixel_block_size;

			} else {
				encoded_pixels = decompression_buffer[ buffer_caret ] + 1;
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + (encoded_pixels * pixel_block_size) > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, encoded_pixels * pixel_block_size * sizeof(int));
				bitmap_caret += (encoded_pixels * pixel_block_size);
				buffer_caret += (encoded_pixels * pixel_block_size);
			}
		}
		gdFree( decompression_buffer );
		gdFree( conversion_buffer );
		break;
	}

	return 1;
}